

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  int iVar5;
  int iVar6;
  ImU32 IVar7;
  GetterXsYs<signed_char> *pGVar8;
  GetterXsYRef<signed_char> *pGVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  double dVar12;
  long lVar13;
  bool bVar14;
  float fVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pGVar8 = this->Getter1;
  pGVar9 = this->Getter2;
  iVar5 = pGVar8->Count;
  lVar13 = (long)(((pGVar8->Offset + prim) % iVar5 + iVar5) % iVar5) * (long)pGVar8->Stride;
  iVar5 = this->Transformer->YAxis;
  dVar16 = (double)GImPlot->PixelRange[iVar5].Min.x;
  dVar2 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar21 = (float)(((double)(int)pGVar8->Xs[lVar13] - dVar2) * GImPlot->Mx + dVar16);
  dVar12 = (double)GImPlot->PixelRange[iVar5].Min.y;
  dVar3 = GImPlot->CurrentPlot->YAxis[iVar5].Range.Min;
  fVar22 = (float)(((double)(int)pGVar8->Ys[lVar13] - dVar3) * GImPlot->My[iVar5] + dVar12);
  iVar6 = pGVar9->Count;
  fVar18 = (float)(((double)(int)pGVar9->Xs
                                 [(long)(((prim + pGVar9->Offset) % iVar6 + iVar6) % iVar6) *
                                  (long)pGVar9->Stride] - dVar2) * GImPlot->Mx + dVar16);
  fVar17 = (float)((pGVar9->YRef - dVar3) * GImPlot->My[iVar5] + dVar12);
  fVar20 = fVar22;
  if (fVar17 <= fVar22) {
    fVar20 = fVar17;
  }
  bVar14 = false;
  if ((fVar20 < (cull_rect->Max).y) &&
     (fVar20 = (float)(~-(uint)(fVar17 <= fVar22) & (uint)fVar17 |
                      -(uint)(fVar17 <= fVar22) & (uint)fVar22), pfVar1 = &(cull_rect->Min).y,
     bVar14 = false, *pfVar1 <= fVar20 && fVar20 != *pfVar1)) {
    fVar20 = fVar21;
    if (fVar18 <= fVar21) {
      fVar20 = fVar18;
    }
    if (fVar20 < (cull_rect->Max).x) {
      fVar20 = (float)(~-(uint)(fVar18 <= fVar21) & (uint)fVar18 |
                      -(uint)(fVar18 <= fVar21) & (uint)fVar21);
      bVar14 = (cull_rect->Min).x <= fVar20 && fVar20 != (cull_rect->Min).x;
    }
  }
  if (bVar14 != false) {
    fVar20 = this->Weight;
    IVar7 = this->Col;
    IVar4 = *uv;
    fVar19 = fVar18 - fVar21;
    fVar23 = fVar17 - fVar22;
    fVar15 = fVar19 * fVar19 + fVar23 * fVar23;
    if (0.0 < fVar15) {
      if (fVar15 < 0.0) {
        fVar15 = sqrtf(fVar15);
      }
      else {
        fVar15 = SQRT(fVar15);
      }
      fVar19 = fVar19 * (1.0 / fVar15);
      fVar23 = fVar23 * (1.0 / fVar15);
    }
    fVar20 = fVar20 * 0.5;
    fVar19 = fVar19 * fVar20;
    fVar20 = fVar20 * fVar23;
    pIVar10 = DrawList->_VtxWritePtr;
    (pIVar10->pos).x = fVar20 + fVar21;
    (pIVar10->pos).y = fVar22 - fVar19;
    pIVar10->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar7;
    pIVar10[1].pos.x = fVar20 + fVar18;
    pIVar10[1].pos.y = fVar17 - fVar19;
    pIVar10[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar7;
    pIVar10[2].pos.x = fVar18 - fVar20;
    pIVar10[2].pos.y = fVar19 + fVar17;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar7;
    pIVar10[3].pos.x = fVar21 - fVar20;
    pIVar10[3].pos.y = fVar19 + fVar22;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar7;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = DrawList->_VtxCurrentIdx;
    puVar11[1] = DrawList->_VtxCurrentIdx + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    puVar11[3] = DrawList->_VtxCurrentIdx;
    puVar11[4] = DrawList->_VtxCurrentIdx + 2;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return bVar14;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }